

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void Cmd_sizeup(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  float volume;
  FSoundID local_20;
  int local_1c;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_1c = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  iVar1 = FIntCVar::operator_cast_to_int(&screenblocks);
  FIntCVar::operator=(&screenblocks,iVar1 + 1);
  FSoundID::FSoundID(&local_20,"menu/change");
  volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
  S_Sound(0x22,&local_20,volume,0.0);
  return;
}

Assistant:

CCMD (sizeup)
{
	screenblocks = screenblocks + 1;
	S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
}